

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

nodeclass * NodeClassResize(nodecontext *p,nodeclass *Old,size_t VMTSize)

{
  ulong uVar1;
  nodeclass *pnVar2;
  long *plVar3;
  long *plVar4;
  nodeclass *pnVar5;
  
  pnVar2 = (nodeclass *)(*p->NodeHeap->ReAlloc)(p->NodeHeap,Old,Old->VMTSize + 0x48,VMTSize + 0x48);
  if (pnVar2 != (nodeclass *)0x0) {
    pnVar2->VMTSize = VMTSize;
    uVar1 = (p->NodeClass)._Used;
    plVar3 = (long *)(p->NodeClass)._Begin;
    plVar4 = plVar3;
    for (; plVar3 != (long *)((long)plVar4 + (uVar1 & 0xfffffffffffffff8)); plVar3 = plVar3 + 1) {
      pnVar5 = (nodeclass *)*plVar3;
      if ((nodeclass *)*plVar3 == Old) {
        *plVar3 = (long)pnVar2;
        pnVar5 = pnVar2;
      }
      if (pnVar5->ParentClass == Old) {
        pnVar5->ParentClass = pnVar2;
      }
      plVar4 = (long *)(p->NodeClass)._Begin;
    }
  }
  return pnVar2;
}

Assistant:

static nodeclass* NodeClassResize(nodecontext* p,nodeclass* Old,size_t VMTSize)
{
    nodeclass* New = MemHeap_ReAlloc(p->NodeHeap,Old,sizeof(nodeclass)+Old->VMTSize,sizeof(nodeclass)+VMTSize);
    if (New)
    {
        nodeclass** i;

        New->VMTSize = VMTSize;

        for (i=ARRAYBEGIN(p->NodeClass,nodeclass*);i!=ARRAYEND(p->NodeClass,nodeclass*);++i)
        {
            if (*i == Old)
                *i = New;
            if ((*i)->ParentClass == Old)
                (*i)->ParentClass = New;
        }
    }
    return New;
}